

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

bool __thiscall
gvr::PLYReader::setReceiver
          (PLYReader *this,string *elem_name,string *prop_name,PLYReceiver *receiver)

{
  PLYElement *this_00;
  PLYProperty *pPVar1;
  
  this_00 = findElement(this,elem_name);
  if ((this_00 != (PLYElement *)0x0) &&
     (pPVar1 = PLYElement::findProperty(this_00,prop_name), pPVar1 != (PLYProperty *)0x0)) {
    pPVar1->receiver = receiver;
    return true;
  }
  return false;
}

Assistant:

bool PLYReader::setReceiver(const std::string &elem_name, const std::string &prop_name,
                            PLYReceiver *receiver)
{
  PLYElement *elem=findElement(elem_name);

  if (elem != 0)
  {
    PLYProperty *prop=elem->findProperty(prop_name);

    if (prop != 0)
    {
      prop->setReceiver(receiver);
      return true;
    }
  }

  return false;
}